

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Double_Window.cxx
# Opt level: O0

void __thiscall Fl_Double_Window::resize(Fl_Double_Window *this,int X,int Y,int W,int H)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Fl_X *pFVar4;
  Fl_X *myi;
  Fl_X *myi_1;
  int oh;
  int ow;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Double_Window *this_local;
  
  iVar1 = Fl_Widget::w((Fl_Widget *)this);
  iVar2 = Fl_Widget::h((Fl_Widget *)this);
  Fl_Window::resize(&this->super_Fl_Window,X,Y,W,H);
  if (use_xdbe == 0) {
    pFVar4 = Fl_X::i(&this->super_Fl_Window);
    if (((pFVar4 != (Fl_X *)0x0) && (pFVar4->other_xid != 0)) &&
       ((iVar3 = Fl_Widget::w((Fl_Widget *)this), iVar1 != iVar3 ||
        (iVar1 = Fl_Widget::h((Fl_Widget *)this), iVar2 != iVar1)))) {
      XFreePixmap(fl_display,pFVar4->other_xid);
      pFVar4->other_xid = 0;
    }
  }
  else {
    pFVar4 = Fl_X::i(&this->super_Fl_Window);
    if (((pFVar4 != (Fl_X *)0x0) && (pFVar4->other_xid != 0)) &&
       ((iVar3 = Fl_Widget::w((Fl_Widget *)this), iVar1 < iVar3 ||
        (iVar1 = Fl_Widget::h((Fl_Widget *)this), iVar2 < iVar1)))) {
      XdbeDeallocateBackBufferName(fl_display,pFVar4->other_xid);
      pFVar4->other_xid = 0;
    }
  }
  return;
}

Assistant:

void Fl_Double_Window::resize(int X,int Y,int W,int H) {
  int ow = w();
  int oh = h();
  Fl_Window::resize(X,Y,W,H);
#if USE_XDBE
  if (use_xdbe) {
    Fl_X* myi = Fl_X::i(this);
    if (myi && myi->other_xid && (ow < w() || oh < h())) {
      // STR #2152: Deallocate the back buffer to force creation of a new one.
      XdbeDeallocateBackBufferName(fl_display,myi->other_xid);
      myi->other_xid = 0;
    }
    return;
  }
#endif
  Fl_X* myi = Fl_X::i(this);
  if (myi && myi->other_xid && (ow != w() || oh != h())) {
    fl_delete_offscreen(myi->other_xid);
    myi->other_xid = 0;
  }
}